

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

ON_BrepFace * __thiscall
ON_Brep::NewFace(ON_Brep *this,ON_Surface *pSurface,int *vid,int *eid,bool *bRev3d)

{
  int face_index;
  ON_Surface **ppOVar1;
  long lVar2;
  int si;
  ulong uVar3;
  ON_BrepFace *pOVar4;
  ON_BrepLoop *pOVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int *local_40;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  if (pSurface == (ON_Surface *)0x0) {
    return (ON_BrepFace *)0x0;
  }
  uVar3 = (ulong)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  bVar8 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    ppOVar1 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a;
    if (*ppOVar1 == pSurface) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar3 - 1 == uVar6) goto LAB_00412dc2;
        uVar7 = uVar6 + 1;
        lVar2 = uVar6 + 1;
        uVar6 = uVar7;
      } while (ppOVar1[lVar2] != pSurface);
      bVar8 = uVar7 < uVar3;
    }
    si = (int)uVar7;
    if (bVar8) {
      bVar8 = false;
      goto LAB_00412dd9;
    }
  }
LAB_00412dc2:
  si = AddSurface(this,pSurface);
  bVar8 = -1 < si;
LAB_00412dd9:
  local_40 = &(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  pOVar4 = NewFace(this,si);
  face_index = pOVar4->m_face_index;
  pOVar5 = NewOuterLoop(this,face_index,vid,eid,bRev3d);
  if (pOVar5 != (ON_BrepLoop *)0x0) {
    return (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a +
           face_index;
  }
  if ((((bVar8) &&
       ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si] = (ON_Surface *)0x0,
       (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count == si + 1)) && (-1 < si)) &&
     (si <= (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity)) {
    *local_40 = si;
  }
  DeleteFace(this,(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                  + face_index,false);
  if ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count !=
      face_index + 1) {
    return (ON_BrepFace *)0x0;
  }
  if (face_index < 0) {
    return (ON_BrepFace *)0x0;
  }
  if (face_index <=
      (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_capacity) {
    (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count =
         face_index;
    return (ON_BrepFace *)0x0;
  }
  return (ON_BrepFace *)0x0;
}

Assistant:

ON_BrepFace* ON_Brep::NewFace(
       ON_Surface* pSurface,
       int vid[4],
       int eid[4],
       bool bRev3d[4]
       )
{
  m_bbox.Destroy();
  m_is_solid = 0;
  bool bAddedSurface = false;
  ON_BrepFace* pFace = nullptr;
  if ( !pSurface )
    return nullptr;
  int si;
  for ( si = 0; si < m_S.Count(); si++ )
  {
    if ( pSurface == m_S[si] )
      break;
  }
  if ( si >= m_S.Count() )
  {
    si = AddSurface(pSurface);
    bAddedSurface = (si >= 0);
  }
  int face_index = NewFace(si).m_face_index;
  if ( NewOuterLoop( face_index, vid, eid, bRev3d ) )
  {
    pFace = &m_F[face_index];
  }
  else 
  {
    // failed
    if ( bAddedSurface )
    {
      m_S[si] = 0;
      if ( m_S.Count() == si+1 )
        m_S.SetCount(si);
    }
    DeleteFace( m_F[face_index], false );
    if ( m_F.Count() == face_index+1 )
    {
      m_F.SetCount(face_index);
    }
  }
  return pFace;
}